

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_seek_to_min_key_with_deletes_test(void)

{
  FILE *pFVar1;
  fdb_status fVar2;
  char *pcVar3;
  fdb_iterator *it;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  it = (fdb_iterator *)0x0;
  rdoc = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fVar2 = fdb_open(&dbfile,"./iterator_test1",&fconfig);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x108b);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x108b,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x108c);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x108c,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fdb_set_kv(db,"B",1,(void *)0x0,0);
  fdb_set_kv(db,"C",1,(void *)0x0,0);
  fVar2 = fdb_del_kv(db,"B",1);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1092);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1092,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_iterator_init(db,&it,"A",1,"B",1,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1095);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1095,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_iterator_get(it,&rdoc);
  if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x1097);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x1097,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_iterator_seek_to_min(it);
  if (fVar2 != FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x109a);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_ITERATOR_FAIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x109a,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_iterator_close(it);
  pFVar1 = _stderr;
  if (fVar2 != FDB_RESULT_SUCCESS) {
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x109d);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x109d,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  fVar2 = fdb_close(dbfile);
  pFVar1 = _stderr;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_shutdown();
    pFVar1 = _stderr;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar3 = "%s PASSED\n";
      if (iterator_seek_to_min_key_with_deletes_test()::__test_pass != '\0') {
        pcVar3 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar3,"iterator seek to min test");
      return;
    }
    pcVar3 = fdb_error_msg(fVar2);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x10a1);
    iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x10a1,"void iterator_seek_to_min_key_with_deletes_test()");
  }
  pcVar3 = fdb_error_msg(fVar2);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar2,pcVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x109f);
  iterator_seek_to_min_key_with_deletes_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x109f,"void iterator_seek_to_min_key_with_deletes_test()");
}

Assistant:

void iterator_seek_to_min_key_with_deletes_test() {
    TEST_INIT();
    memleak_start();

    int r;

    fdb_status status;
    fdb_kvs_handle *db;
    fdb_file_handle *dbfile;
    fdb_iterator *it = nullptr;
    fdb_doc *rdoc = nullptr;


    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;
    TEST_STATUS(fdb_open(&dbfile, "./iterator_test1", &fconfig));
    TEST_STATUS(fdb_kvs_open_default(dbfile, &db, &kvs_config));

    fdb_set_kv(db, "B", 1, NULL, 0);
    fdb_set_kv(db, "C", 1, NULL, 0);

    status = fdb_del_kv(db, "B", 1);
    TEST_STATUS(status);

    status = fdb_iterator_init(db, &it, "A", 1, "B", 1, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_seek_to_min(it);
    TEST_CHK(status == FDB_RESULT_ITERATOR_FAIL);

    status = fdb_iterator_close(it);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();

    TEST_RESULT("iterator seek to min test");
}